

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O3

void __thiscall
portability_path_test_portability_path_test_path_get_name_double_extension_Test::TestBody
          (portability_path_test_portability_path_test_path_get_name_double_extension_Test *this)

{
  undefined8 *puVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  string_name name;
  AssertHelper local_848;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_840;
  internal local_838 [8];
  undefined8 *local_830;
  char local_828 [2056];
  
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           portability_path_get_name("/a/b/c/.asd.yes",0x10,local_828,0x800);
  local_840._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_840._M_head_impl._4_4_ << 0x20);
  local_848.data_._0_4_ = strcmp(local_828,".asd");
  testing::internal::CmpHelperEQ<int,int>
            (local_838,"(int)0","(int)strcmp(name, result)",(int *)&local_840,(int *)&local_848);
  if (local_838[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_840);
    if (local_830 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_830;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0xb2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_848,(Message *)&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    if (local_840._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_840._M_head_impl + 8))();
    }
  }
  puVar1 = local_830;
  if (local_830 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_830 != local_830 + 2) {
      operator_delete((undefined8 *)*local_830);
    }
    operator_delete(puVar1);
  }
  local_848.data_ = (AssertHelperData *)0x5;
  local_840._M_head_impl = pbVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_838,"(size_t)size","(size_t)sizeof(result)",(unsigned_long *)&local_840,
             (unsigned_long *)&local_848);
  if (local_838[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_840);
    if (local_830 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_830;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0xb3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_848,(Message *)&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    if (local_840._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_840._M_head_impl + 8))();
    }
  }
  puVar1 = local_830;
  if (local_830 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_830 != local_830 + 2) {
      operator_delete((undefined8 *)*local_830);
    }
    operator_delete(puVar1);
  }
  local_840._M_head_impl = local_840._M_head_impl & 0xffffffffffffff00;
  local_848.data_._0_1_ = "/a/b/c/.asd.yes"[(long)(pbVar2 + 0xf)];
  testing::internal::CmpHelperEQ<char,char>
            (local_838,"(char)\'\\0\'","(char)result[size - 1]",(char *)&local_840,
             (char *)&local_848);
  if (local_838[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_840);
    if (local_830 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_830;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0xb4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_848,(Message *)&local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    if (local_840._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_840._M_head_impl + 8))();
    }
  }
  if (local_830 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_830 != local_830 + 2) {
      operator_delete((undefined8 *)*local_830);
    }
    operator_delete(local_830);
  }
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_name_double_extension)
{
	static const char base[] = "/a/b/c/.asd.yes";
	static const char result[] = ".asd";

	string_name name;

	size_t size = portability_path_get_name(base, sizeof(base), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}